

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O0

void xc_rho2dzeta(int nspin,double *rho,double *d,double *zeta)

{
  double local_38;
  double local_30;
  double local_28;
  double *zeta_local;
  double *d_local;
  double *rho_local;
  int nspin_local;
  
  if (nspin == 1) {
    if (0.0 < *rho || *rho == 0.0) {
      local_28 = *rho;
    }
    else {
      local_28 = 0.0;
    }
    *d = local_28;
    *zeta = 0.0;
  }
  else {
    *d = *rho + rho[1];
    if (*d <= 0.0) {
      *d = 0.0;
      *zeta = 0.0;
    }
    else {
      *zeta = (*rho - rho[1]) / *d;
      if (1.0 < *zeta || *zeta == 1.0) {
        local_30 = 1.0;
      }
      else {
        local_30 = *zeta;
      }
      *zeta = local_30;
      if (-1.0 < *zeta || *zeta == -1.0) {
        local_38 = *zeta;
      }
      else {
        local_38 = -1.0;
      }
      *zeta = local_38;
    }
  }
  return;
}

Assistant:

GPU_FUNCTION void
xc_rho2dzeta(int nspin, const double *rho, double *d, double *zeta)
{
  if(nspin==XC_UNPOLARIZED){
    *d    = m_max(rho[0], 0.0);
    *zeta = 0.0;
  }else{
    *d = rho[0] + rho[1];
    if(*d > 0.0){
      *zeta = (rho[0] - rho[1])/(*d);
      *zeta = m_min(*zeta,  1.0);
      *zeta = m_max(*zeta, -1.0);
    }else{
      *d    = 0.0;
      *zeta = 0.0;
    }
  }
}